

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O1

void __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::ClassSet(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           *this,int pmax)

{
  undefined8 *puVar1;
  Item *pIVar2;
  long lVar3;
  long lVar4;
  int n;
  
  if (pmax < 1) {
    pmax = 8;
  }
  this->theitem = (Item *)0x0;
  this->thekey = (DataKey *)0x0;
  this->themax = pmax;
  this->thesize = 0;
  this->thenum = 0;
  this->firstfree = ~pmax;
  spx_alloc<soplex::ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::DLPSV>::Item*>
            (&this->theitem,pmax);
  n = this->themax;
  if (0 < n) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pIVar2 = this->theitem;
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)&(pIVar2->data).thenext + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(pIVar2->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pIVar2->info + lVar3) = 0;
      n = this->themax;
      lVar3 = lVar3 + 0x28;
    } while (lVar4 < n);
  }
  spx_alloc<soplex::DataKey*>(&this->thekey,n);
  return;
}

Assistant:

explicit
   ClassSet(int pmax = 8)
      : theitem(nullptr)
      , thekey(nullptr)
      , themax(pmax < 1 ? 8 : pmax)
      , thesize(0)
      , thenum(0)

   {
      firstfree = -themax - 1;

      spx_alloc(theitem, themax);

      /* call default constructor for each element */
      for(int i = 0; i < themax; i++)
         new(&(theitem[i])) Item();

      try
      {
         spx_alloc(thekey, themax);
      }
      catch(const SPxMemoryException& x)
      {
         spx_free(theitem);
         throw x;
      }

      assert(isConsistent());
   }